

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

ByteData256 * __thiscall
cfd::core::ConfidentialTxOut::GetWitnessHash
          (ByteData256 *__return_storage_ptr__,ConfidentialTxOut *this)

{
  pointer puVar1;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> leaves;
  ByteData256 local_58;
  ByteData local_40;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_28;
  
  ByteData256::ByteData256(__return_storage_ptr__);
  local_28.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ByteData::Serialize(&local_40,&this->surjection_proof_);
  HashUtil::Sha256D(&local_58,&local_40);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
  emplace_back<cfd::core::ByteData256>(&local_28,&local_58);
  if (local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_40.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ByteData::Serialize(&local_40,&this->range_proof_);
  HashUtil::Sha256D(&local_58,&local_40);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
  emplace_back<cfd::core::ByteData256>(&local_28,&local_58);
  if (local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_40.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  CryptoUtil::ComputeFastMerkleRoot
            (&local_58,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&local_28);
  puVar1 = (__return_storage_ptr__->data_).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (__return_storage_ptr__->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  if (local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_28)
  ;
  return __return_storage_ptr__;
}

Assistant:

ByteData256 ConfidentialTxOut::GetWitnessHash() const {
  ByteData256 result;
  std::vector<ByteData256> leaves;
  leaves.push_back(HashUtil::Sha256D(surjection_proof_.Serialize()));
  leaves.push_back(HashUtil::Sha256D(range_proof_.Serialize()));
  result = CryptoUtil::ComputeFastMerkleRoot(leaves);
  return result;
}